

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O3

void puppup::movegen::print(Move *mov,State *state,Gaddag *gaddag)

{
  ostream *poVar1;
  long lVar2;
  idx *piVar3;
  byte bVar4;
  idx aiStack_1048 [513];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  bVar4 = 0;
  if (mov->word == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CHANGE 7",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  piVar3 = aiStack_1048;
  for (lVar2 = 0x201; lVar2 != 0; lVar2 = lVar2 + -1) {
    *piVar3 = state->score;
    state = (State *)((long)state + (ulong)bVar4 * -0x10 + 8);
    piVar3 = piVar3 + (ulong)bVar4 * -2 + 1;
  }
  toString_abi_cxx11_(&local_40,(movegen *)mov,gaddag);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

inline void print(const Move& mov, const board::State& state,
                  const trie::Gaddag& gaddag) {
    if (mov.word == -1) {
        std::cout << "CHANGE 7" << std::endl;
    }
    std::cout << toString(mov, state, gaddag) << " " << mov.score << std::endl;
}